

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normal_matrix.cc
# Opt level: O0

void __thiscall
ipx::NormalMatrix::_Apply(NormalMatrix *this,Vector *rhs,Vector *lhs,double *rhs_dot_lhs)

{
  int iVar1;
  Int IVar2;
  Int IVar3;
  Int *pIVar4;
  Int *pIVar5;
  double *pdVar6;
  double *pdVar7;
  double *in_RCX;
  valarray<double> *in_RDX;
  valarray<double> *in_RSI;
  long in_RDI;
  double dVar8;
  Int p_3;
  Int p_2;
  double d_1;
  Int end_1;
  Int begin_1;
  Int j_1;
  Int p_1;
  Int p;
  double d;
  Int end;
  Int begin;
  Int j;
  Int i;
  Timer timer;
  double *Ax;
  Int *Ai;
  Int *Ap;
  Int n;
  Int m;
  double *in_stack_ffffffffffffff38;
  valarray<double> *in_stack_ffffffffffffff40;
  Vector *in_stack_ffffffffffffff58;
  Vector *in_stack_ffffffffffffff60;
  int local_90;
  int local_8c;
  valarray<double> *local_88;
  int local_74;
  int local_68;
  int local_64;
  double local_60;
  int local_50;
  int local_4c;
  
  IVar2 = Model::rows(*(Model **)(in_RDI + 8));
  IVar3 = Model::cols(*(Model **)(in_RDI + 8));
  Model::AI(*(Model **)(in_RDI + 8));
  pIVar4 = SparseMatrix::colptr((SparseMatrix *)0x84c303);
  Model::AI(*(Model **)(in_RDI + 8));
  pIVar5 = SparseMatrix::rowidx((SparseMatrix *)0x84c324);
  Model::AI(*(Model **)(in_RDI + 8));
  pdVar6 = SparseMatrix::values((SparseMatrix *)0x84c345);
  Timer::Timer((Timer *)in_stack_ffffffffffffff40);
  if (*(long *)(in_RDI + 0x10) == 0) {
    std::valarray<double>::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    for (local_74 = 0; local_74 < IVar3; local_74 = local_74 + 1) {
      local_90 = pIVar4[local_74];
      iVar1 = pIVar4[local_74 + 1];
      local_88 = (valarray<double> *)0x0;
      for (local_8c = local_90; local_8c < iVar1; local_8c = local_8c + 1) {
        pdVar7 = std::valarray<double>::operator[](in_RSI,(long)pIVar5[local_8c]);
        local_88 = (valarray<double> *)(*pdVar7 * pdVar6[local_8c] + (double)local_88);
      }
      for (; local_90 < iVar1; local_90 = local_90 + 1) {
        dVar8 = pdVar6[local_90];
        in_stack_ffffffffffffff40 = local_88;
        pdVar7 = std::valarray<double>::operator[](in_RDX,(long)pIVar5[local_90]);
        *pdVar7 = (double)in_stack_ffffffffffffff40 * dVar8 + *pdVar7;
      }
    }
  }
  else {
    for (local_4c = 0; local_4c < IVar2; local_4c = local_4c + 1) {
      pdVar7 = std::valarray<double>::operator[](in_RSI,(long)local_4c);
      in_stack_ffffffffffffff60 =
           (Vector *)
           (*pdVar7 * *(double *)(*(long *)(in_RDI + 0x10) + (long)(IVar3 + local_4c) * 8));
      pdVar7 = std::valarray<double>::operator[](in_RDX,(long)local_4c);
      *pdVar7 = (double)in_stack_ffffffffffffff60;
    }
    for (local_50 = 0; local_50 < IVar3; local_50 = local_50 + 1) {
      local_68 = pIVar4[local_50];
      iVar1 = pIVar4[local_50 + 1];
      local_60 = 0.0;
      for (local_64 = local_68; local_64 < iVar1; local_64 = local_64 + 1) {
        pdVar7 = std::valarray<double>::operator[](in_RSI,(long)pIVar5[local_64]);
        local_60 = *pdVar7 * pdVar6[local_64] + local_60;
      }
      dVar8 = *(double *)(*(long *)(in_RDI + 0x10) + (long)local_50 * 8);
      for (; local_68 < iVar1; local_68 = local_68 + 1) {
        in_stack_ffffffffffffff58 = (Vector *)pdVar6[local_68];
        pdVar7 = std::valarray<double>::operator[](in_RDX,(long)pIVar5[local_68]);
        *pdVar7 = dVar8 * local_60 * (double)in_stack_ffffffffffffff58 + *pdVar7;
      }
    }
  }
  if (in_RCX != (double *)0x0) {
    dVar8 = Dot(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    *in_RCX = dVar8;
  }
  dVar8 = Timer::Elapsed((Timer *)in_stack_ffffffffffffff40);
  *(double *)(in_RDI + 0x30) = dVar8 + *(double *)(in_RDI + 0x30);
  return;
}

Assistant:

void NormalMatrix::_Apply(const Vector& rhs, Vector& lhs,
                           double* rhs_dot_lhs) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Int* Ap = model_.AI().colptr();
    const Int* Ai = model_.AI().rowidx();
    const double* Ax = model_.AI().values();
    #if MATVECMETHOD == 2
    const Int* Atp = model_.AIt().colptr();
    const Int* Ati = model_.AIt().rowidx();
    const double* Atx = model_.AIt().values();
    #endif
    Timer timer;

    assert(prepared_);
    assert((Int)lhs.size() == m);
    assert((Int)rhs.size() == m);

    if (W_) {
        #if MATVECMETHOD == 1
        for (Int i = 0; i < m; i++)
            lhs[i] = rhs[i] * W_[n+i];
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            d *= W_[j];
            for (Int p = begin; p < end; p++)
                lhs[Ai[p]] += d * Ax[p];
        }
        #elif MATVECMETHOD == 2
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            work_[j] = d * W_[j];
        }
        for (Int i = 0; i < m; i++)
            lhs[i] = rhs[i] * W_[n+i];
        for (Int i = 0; i < m; i++) {
            Int begin = Atp[i], end = Atp[i+1]-1; // skip identity entry
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += work_[Ati[p]] * Atx[p];
            lhs[i] += d;
        }
        #elif MATVECMETHOD == 3
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            work_[j] = d * W_[j];
        }
        for (Int i = 0; i < m; i++)
            lhs[i] = rhs[i] * W_[n+i];
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = work_[j];
            for (Int p = begin; p < end; p++)
                lhs[Ai[p]] += d * Ax[p];
        }
        #else
        #error "invalid MATHVECMETHOD"
        #endif
    } else {
        lhs = 0.0;
        for (Int j = 0; j < n; j++) {
            Int begin = Ap[j], end = Ap[j+1];
            double d = 0.0;
            for (Int p = begin; p < end; p++)
                d += rhs[Ai[p]] * Ax[p];
            for (Int p = begin; p < end; p++)
                lhs[Ai[p]] += d * Ax[p];
        }
    }
    if (rhs_dot_lhs)
        *rhs_dot_lhs = Dot(rhs,lhs);
    time_ += timer.Elapsed();
}